

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkUpdateReverseLevel(Abc_Obj_t *pObjNew,Vec_Vec_t *vLevels)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  int local_3c;
  int local_38;
  int m;
  int k;
  int Lev;
  int LevFanin;
  int LevelOld;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pFanin;
  Vec_Vec_t *vLevels_local;
  Abc_Obj_t *pObjNew_local;
  
  m = Abc_ObjReverseLevel(pObjNew);
  iVar1 = Abc_ObjReverseLevelNew(pObjNew);
  if (m != iVar1) {
    Vec_VecClear(vLevels);
    Vec_VecPush(vLevels,m,pObjNew);
    *(uint *)&pObjNew->field_0x14 = *(uint *)&pObjNew->field_0x14 & 0xffffffef | 0x10;
    for (; iVar1 = Vec_VecSize(vLevels), m < iVar1; m = m + 1) {
      local_38 = 0;
      while( true ) {
        pVVar2 = Vec_VecEntry(vLevels,m);
        iVar1 = Vec_PtrSize(pVVar2);
        if (iVar1 <= local_38) break;
        pVVar2 = Vec_VecEntry(vLevels,m);
        pObj = (Abc_Obj_t *)Vec_PtrEntry(pVVar2,local_38);
        *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffef;
        iVar1 = Abc_ObjReverseLevel(pObj);
        if (iVar1 != m) {
          __assert_fail("LevelOld == Lev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcTiming.c"
                        ,0x547,"void Abc_NtkUpdateReverseLevel(Abc_Obj_t *, Vec_Vec_t *)");
        }
        iVar1 = Abc_ObjReverseLevelNew(pObj);
        Abc_ObjSetReverseLevel(pObj,iVar1);
        iVar1 = Abc_ObjReverseLevel(pObj);
        if (iVar1 != m) {
          for (local_3c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_3c < iVar1;
              local_3c = local_3c + 1) {
            pObj_00 = Abc_ObjFanin(pObj,local_3c);
            iVar1 = Abc_ObjIsCi(pObj_00);
            if ((iVar1 == 0) && ((*(uint *)&pObj_00->field_0x14 >> 4 & 1) == 0)) {
              iVar1 = Abc_ObjReverseLevel(pObj_00);
              if (iVar1 < m) {
                __assert_fail("LevFanin >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcTiming.c"
                              ,0x552,"void Abc_NtkUpdateReverseLevel(Abc_Obj_t *, Vec_Vec_t *)");
              }
              Vec_VecPush(vLevels,iVar1,pObj_00);
              *(uint *)&pObj_00->field_0x14 = *(uint *)&pObj_00->field_0x14 & 0xffffffef | 0x10;
            }
          }
        }
        local_38 = local_38 + 1;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkUpdateReverseLevel( Abc_Obj_t * pObjNew, Vec_Vec_t * vLevels )
{
    Abc_Obj_t * pFanin, * pTemp;
    int LevelOld, LevFanin, Lev, k, m;
    // check if level has changed
    LevelOld = Abc_ObjReverseLevel(pObjNew);
    if ( LevelOld == Abc_ObjReverseLevelNew(pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( vLevels );
    Vec_VecPush( vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Abc_Obj_t *, vLevels, pTemp, Lev, k, LevelOld )
    {
        pTemp->fMarkA = 0;
        LevelOld = Abc_ObjReverseLevel(pTemp); 
        assert( LevelOld == Lev );
        Abc_ObjSetReverseLevel( pTemp, Abc_ObjReverseLevelNew(pTemp) );
        // if the level did not change, no need to check the fanout levels
        if ( Abc_ObjReverseLevel(pTemp) == Lev )
            continue;
        // schedule fanins for level update
        Abc_ObjForEachFanin( pTemp, pFanin, m )
        {
            if ( !Abc_ObjIsCi(pFanin) && !pFanin->fMarkA )
            {
                LevFanin = Abc_ObjReverseLevel( pFanin );
                assert( LevFanin >= Lev );
                Vec_VecPush( vLevels, LevFanin, pFanin );
                pFanin->fMarkA = 1;
            }
        }
    }
}